

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::SubroutinesGeometry::Run(SubroutinesGeometry *this)

{
  GLuint program_00;
  char *src_vs;
  char *src_tcs;
  char *src_tes;
  char *src_gs;
  char *src_fs;
  long local_d0;
  long error;
  string local_a8 [32];
  string local_88 [48];
  string local_58 [32];
  string local_38 [36];
  GLuint local_14;
  SubroutinesGeometry *pSStack_10;
  GLuint program;
  SubroutinesGeometry *this_local;
  
  pSStack_10 = this;
  (*(this->super_SubroutinesBase).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x16])();
  src_vs = (char *)std::__cxx11::string::c_str();
  (*(this->super_SubroutinesBase).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x18])(local_58);
  src_tcs = (char *)std::__cxx11::string::c_str();
  (*(this->super_SubroutinesBase).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x19])(local_88);
  src_tes = (char *)std::__cxx11::string::c_str();
  (*(this->super_SubroutinesBase).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x1a])(local_a8);
  src_gs = (char *)std::__cxx11::string::c_str();
  (*(this->super_SubroutinesBase).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x17])(&error);
  src_fs = (char *)std::__cxx11::string::c_str();
  program_00 = PIQBase::CreateProgram((PIQBase *)this,src_vs,src_tcs,src_tes,src_gs,src_fs,false);
  std::__cxx11::string::~string((string *)&error);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  local_14 = program_00;
  glu::CallLogWrapper::glBindAttribLocation
            (&(this->super_SubroutinesBase).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,program_00,0,"position");
  glu::CallLogWrapper::glBindFragDataLocation
            (&(this->super_SubroutinesBase).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,local_14,0,"color");
  PIQBase::LinkProgram((PIQBase *)this,local_14);
  local_d0 = 0;
  (*(this->super_SubroutinesBase).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x1d])(this,(ulong)local_14,&local_d0);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_SubroutinesBase).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,local_14);
  return local_d0;
}

Assistant:

virtual long Run()
	{
		GLuint program = CreateProgram(VertexShader().c_str(), TessControlShader().c_str(), TessEvalShader().c_str(),
									   GeometryShader().c_str(), FragmentShader().c_str(), false);
		glBindAttribLocation(program, 0, "position");
		glBindFragDataLocation(program, 0, "color");
		LinkProgram(program);
		long error = NO_ERROR;

		VerifyGEO(program, error);

		glDeleteProgram(program);
		return error;
	}